

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O3

ares_status_t ares_conn_set_sockaddr(ares_conn_t *conn,sockaddr *sa,ares_socklen_t *salen)

{
  ushort uVar1;
  undefined8 uVar2;
  uint *in_RCX;
  
  uVar1 = *(ushort *)((long)&(conn->self_ip).addr + (ulong)((uint)sa & 1) * 2 + 0xc);
  if (conn->fd == 10) {
    if (*in_RCX < 0x1c) {
      return ARES_EFORMERR;
    }
    *in_RCX = 0x1c;
    salen[1] = 0;
    salen[2] = 0;
    salen[3] = 0;
    salen[4] = 0;
    salen[5] = 0;
    salen[6] = 0;
    *(undefined2 *)salen = 10;
    *(ushort *)((long)salen + 2) = uVar1 << 8 | uVar1 >> 8;
    uVar2 = *(undefined8 *)((long)&(conn->self_ip).addr + 4);
    *(undefined8 *)(salen + 2) = *(undefined8 *)&conn->self_ip;
    *(undefined8 *)(salen + 4) = uVar2;
    salen[6] = *(ares_socklen_t *)((long)&conn[1].self_ip.addr + 8);
  }
  else {
    if (conn->fd != 2) {
      return ARES_EBADFAMILY;
    }
    if (*in_RCX < 0x10) {
      return ARES_EFORMERR;
    }
    *in_RCX = 0x10;
    salen[3] = 0;
    salen[1] = 0;
    salen[2] = 0;
    *(undefined2 *)salen = 2;
    *(ushort *)((long)salen + 2) = uVar1 << 8 | uVar1 >> 8;
    salen[1] = (conn->self_ip).family;
  }
  return ARES_SUCCESS;
}

Assistant:

static ares_status_t ares_conn_set_sockaddr(const ares_conn_t *conn,
                                            struct sockaddr   *sa,
                                            ares_socklen_t    *salen)
{
  const ares_server_t *server = conn->server;
  unsigned short       port =
    conn->flags & ARES_CONN_FLAG_TCP ? server->tcp_port : server->udp_port;
  struct sockaddr_in  *sin;
  struct sockaddr_in6 *sin6;

  switch (server->addr.family) {
    case AF_INET:
      sin = (struct sockaddr_in *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin);
      memset(sin, 0, sizeof(*sin));
      sin->sin_family = AF_INET;
      sin->sin_port   = htons(port);
      memcpy(&sin->sin_addr, &server->addr.addr.addr4, sizeof(sin->sin_addr));
      return ARES_SUCCESS;
    case AF_INET6:
      sin6 = (struct sockaddr_in6 *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin6)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin6);
      memset(sin6, 0, sizeof(*sin6));
      sin6->sin6_family = AF_INET6;
      sin6->sin6_port   = htons(port);
      memcpy(&sin6->sin6_addr, &server->addr.addr.addr6,
             sizeof(sin6->sin6_addr));
#ifdef HAVE_STRUCT_SOCKADDR_IN6_SIN6_SCOPE_ID
      sin6->sin6_scope_id = server->ll_scope;
#endif
      return ARES_SUCCESS;
    default:
      break;
  }

  return ARES_EBADFAMILY;
}